

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O0

Point Text::extent(u16string *string)

{
  Point PVar1;
  bool bVar2;
  reference pcVar3;
  const_iterator cStack_30;
  char16_t c;
  const_iterator __end1;
  const_iterator __begin1;
  u16string *__range1;
  u16string *string_local;
  Point result;
  
  Point::Point((Point *)&string_local);
  __end1 = std::__cxx11::
           basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::begin
                     (string);
  cStack_30 = std::__cxx11::
              basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::end
                        (string);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0);
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
             ::operator*(&__end1);
    if (*pcVar3 == L'\n') {
      string_local._0_4_ = (uint)string_local + 1;
      string_local._4_4_ = 0;
    }
    else {
      string_local._4_4_ = string_local._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
    ::operator++(&__end1);
  }
  PVar1.column = string_local._4_4_;
  PVar1.row = (uint)string_local;
  return PVar1;
}

Assistant:

Point Text::extent(const std::u16string &string) {
  Point result;
  for (auto c : string) {
    if (c == '\n') {
      result.row++;
      result.column = 0;
    } else {
      result.column++;
    }
  }
  return result;
}